

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra-test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3aa4::OutputRedirectTest_ErrorInDtor_Test::TestBody
          (OutputRedirectTest_ErrorInDtor_Test *this)

{
  file __fd;
  bool bVar1;
  OutputRedirect *this_00;
  AssertionResult *pAVar2;
  int __fd2;
  char *pcVar3;
  string_view message;
  file write_end;
  file write_copy;
  file read_end;
  AssertionResult gtest_ar_1;
  buffered_file f;
  scoped_ptr<OutputRedirect> redir;
  string gtest_output;
  AssertionResult gtest_ar;
  OutputRedirect gtest_redir;
  
  read_end.fd_ = -1;
  write_end.fd_ = -1;
  fmt::v5::file::pipe(&read_end,&write_end.fd_);
  __fd = write_end;
  fmt::v5::file::dup(&write_copy,write_end.fd_);
  fmt::v5::file::fdopen((file *)&f,(int)&write_end,"w");
  this_00 = (OutputRedirect *)operator_new(0x10);
  OutputRedirect::OutputRedirect(this_00,f.file_);
  gtest_ar_1.success_ = true;
  redir.ptr_ = this_00;
  gtest_output._M_dataplus._M_p._0_4_ = fputc(0x78,(FILE *)f.file_);
  testing::internal::CmpHelperEQ<char,int>
            ((internal *)&gtest_ar,"\'x\'","fputc(\'x\', f.get())",&gtest_ar_1.success_,
             (int *)&gtest_output);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_output);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
               ,399,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_output)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_output);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar_1.success_ == true) {
    message.size_ = 0x13;
    message.data_ = "cannot flush stream";
    format_system_error_abi_cxx11_((string *)&gtest_ar,9,message);
    OutputRedirect::OutputRedirect(&gtest_redir,_stderr);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      close(__fd.fd_);
      testing::internal::scoped_ptr<OutputRedirect>::reset(&redir,(OutputRedirect *)0x0);
    }
    OutputRedirect::restore_and_read_abi_cxx11_(&gtest_output,&gtest_redir);
    bVar1 = std::operator!=(&gtest_output,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &gtest_ar);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&gtest_output);
      OutputRedirect::~OutputRedirect(&gtest_redir);
      std::__cxx11::string::~string((string *)&gtest_ar);
      goto LAB_001151b2;
    }
    pAVar2 = testing::AssertionResult::operator<<
                       (&gtest_ar_1,
                        (char (*) [71])
                        "{ close(write_fd); redir.reset(nullptr); } produces different output.\n");
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x1483f5);
    pAVar2 = testing::AssertionResult::operator<<
                       (pAVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &gtest_ar);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])0x148ae2);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x1483e9);
    testing::AssertionResult::operator<<(pAVar2,&gtest_output);
    std::__cxx11::string::~string((string *)&gtest_output);
    OutputRedirect::~OutputRedirect(&gtest_redir);
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  if (gtest_ar_1.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_output,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
             ,0x197,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_output,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_output);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
LAB_001151b2:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  fmt::v5::file::dup2(&write_copy,__fd.fd_,__fd2);
  testing::internal::scoped_ptr<OutputRedirect>::~scoped_ptr(&redir);
  fmt::v5::buffered_file::~buffered_file(&f);
  fmt::v5::file::~file(&write_copy);
  fmt::v5::file::~file(&write_end);
  fmt::v5::file::~file(&read_end);
  return;
}

Assistant:

TEST(OutputRedirectTest, ErrorInDtor) {
  file read_end, write_end;
  file::pipe(read_end, write_end);
  int write_fd = write_end.descriptor();
  file write_copy = write_end.dup(write_fd);
  buffered_file f = write_end.fdopen("w");
  scoped_ptr<OutputRedirect> redir(new OutputRedirect(f.get()));
  // Put a character in a file buffer.
  EXPECT_EQ('x', fputc('x', f.get()));
  EXPECT_WRITE(stderr, {
      // The close function must be called inside EXPECT_WRITE, otherwise
      // the system may recycle closed file descriptor when redirecting the
      // output in EXPECT_STDERR and the second close will break output
      // redirection.
      FMT_POSIX(close(write_fd));
      SUPPRESS_ASSERT(redir.reset(FMT_NULL));
  }, format_system_error(EBADF, "cannot flush stream"));
  write_copy.dup2(write_fd); // "undo" close or dtor of buffered_file will fail
}